

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O1

void rlVertex3f(float x,float y,float z)

{
  int *piVar1;
  int iVar2;
  VertexBuffer *pVVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  
  if (RLGL.State.transformRequired) {
    fVar4 = RLGL.State.transform.m8 * z;
    fVar6 = RLGL.State.transform.m1 * x;
    fVar5 = RLGL.State.transform.m9 * z;
    z = z * RLGL.State.transform.m10 + x * RLGL.State.transform.m2 + y * RLGL.State.transform.m6 +
        RLGL.State.transform.m14;
    x = fVar4 + RLGL.State.transform.m0 * x + RLGL.State.transform.m4 * y + RLGL.State.transform.m12
    ;
    y = fVar5 + fVar6 + RLGL.State.transform.m5 * y + RLGL.State.transform.m13;
  }
  pVVar3 = (RLGL.currentBatch)->vertexBuffer;
  iVar2 = (RLGL.currentBatch)->currentBuffer;
  if (pVVar3[iVar2].elementsCount * 4 <= pVVar3[iVar2].vCounter) {
    TraceLog(5,"RLGL: Batch elements overflow");
    return;
  }
  pVVar3[iVar2].vertices[(long)pVVar3[iVar2].vCounter * 3] = x;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
  [(long)(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3 + 1] = y
  ;
  (RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vertices
  [(long)(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter * 3 + 2] = z
  ;
  piVar1 = &(RLGL.currentBatch)->vertexBuffer[(RLGL.currentBatch)->currentBuffer].vCounter;
  *piVar1 = *piVar1 + 1;
  piVar1 = &(RLGL.currentBatch)->draws[(long)(RLGL.currentBatch)->drawsCounter + -1].vertexCount;
  *piVar1 = *piVar1 + 1;
  return;
}

Assistant:

void rlVertex3f(float x, float y, float z)
{
    Vector3 vec = { x, y, z };

    // Transform provided vector if required
    if (RLGL.State.transformRequired) vec = Vector3Transform(vec, RLGL.State.transform);

    // Verify that current vertex buffer elements limit has not been reached
    if (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter < (RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].elementsCount*4))
    {
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter] = vec.x;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter + 1] = vec.y;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vertices[3*RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter + 2] = vec.z;
        RLGL.currentBatch->vertexBuffer[RLGL.currentBatch->currentBuffer].vCounter++;

        RLGL.currentBatch->draws[RLGL.currentBatch->drawsCounter - 1].vertexCount++;
    }
    else TRACELOG(LOG_ERROR, "RLGL: Batch elements overflow");
}